

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O3

TonkResult tonk_socket_create(TonkSocketConfig *config,TonkSocket *socketOut,TonkJson *errorJsonOut)

{
  undefined8 uVar1;
  int iVar2;
  OutputWorker *this;
  ErrorResult *pEVar3;
  ApplicationSession *this_00;
  TonkResult TVar4;
  Result result;
  Result local_58;
  undefined1 local_50 [40];
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&m_SessionCounterLock);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (m_SessionCounter == 0) {
    this = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Start(this);
    StartWLANOptimizerThread();
    tonk::Firewall_Initialize();
  }
  m_SessionCounter = m_SessionCounter + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&m_SessionCounterLock);
  local_58.Error = (ErrorResult *)0x0;
  if (config == (TonkSocketConfig *)0x0 || socketOut == (TonkSocket *)0x0) {
    local_50._0_8_ = (ErrorResult *)(local_50 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Null parameter","");
    pEVar3 = (ErrorResult *)operator_new(0x38);
    pEVar3->Source = "tonk_socket_create";
    (pEVar3->Description)._M_dataplus._M_p = (pointer)&(pEVar3->Description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pEVar3->Description,local_50._0_8_,
               (char *)(local_50._8_8_ + local_50._0_8_));
    pEVar3->Type = Tonk;
    pEVar3->Code = 2;
    local_50._32_4_ = 0;
    local_50._36_4_ = 0;
    local_58.Error = pEVar3;
    tonk::Result::~Result((Result *)(local_50 + 0x20));
    if ((ErrorResult *)local_50._0_8_ != (ErrorResult *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_);
    }
    if (socketOut != (TonkSocket *)0x0) goto LAB_00131905;
  }
  else {
    if (config->Version == 9) {
      iVar2 = siamese_init_(5);
      if (iVar2 == 0) {
        tonk::SecureRandom_Initialize();
        local_58.Error = (ErrorResult *)local_50._0_8_;
        local_50._0_8_ = (ErrorResult *)0x0;
        tonk::Result::~Result((Result *)local_50);
        if (local_58.Error == (ErrorResult *)0x0) {
          tonk::InitializeAddressHash();
          local_58.Error = (ErrorResult *)local_50._0_8_;
          local_50._0_8_ = (ErrorResult *)0x0;
          tonk::Result::~Result((Result *)local_50);
          if (local_58.Error == (ErrorResult *)0x0) {
            ValidateTonkSocketConfig((TonkSocketConfig *)local_50);
            local_58.Error = (ErrorResult *)local_50._0_8_;
            local_50._0_8_ = (ErrorResult *)0x0;
            tonk::Result::~Result((Result *)local_50);
            if (local_58.Error == (ErrorResult *)0x0) {
              this_00 = (ApplicationSession *)operator_new(0x3ac8,(nothrow_t *)&std::nothrow);
              if (this_00 == (ApplicationSession *)0x0) {
                local_50._0_8_ = local_50 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_50,"Out of memory","");
                pEVar3 = (ErrorResult *)operator_new(0x38);
                pEVar3->Source = "tonk_socket_create";
                (pEVar3->Description)._M_dataplus._M_p = (pointer)&(pEVar3->Description).field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&pEVar3->Description,local_50._0_8_,
                           (char *)(local_50._8_8_ + local_50._0_8_));
                pEVar3->Type = Tonk;
                pEVar3->Code = 2;
                goto LAB_001318e1;
              }
              tonk::ApplicationSession::ApplicationSession(this_00);
              tonk::ApplicationSession::Initialize
                        ((ApplicationSession *)local_50,(TonkSocketConfig *)this_00);
              local_58.Error = (ErrorResult *)local_50._0_8_;
              local_50._0_8_ = (ErrorResult *)0x0;
              tonk::Result::~Result((Result *)local_50);
              if (local_58.Error == (ErrorResult *)0x0) {
                *socketOut = (TonkSocket)this_00;
                goto LAB_00131911;
              }
              (*(this_00->super_INATPortPool)._vptr_INATPortPool[1])(this_00);
            }
          }
        }
        goto LAB_00131905;
      }
      local_50._0_8_ = local_50 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"siamese_init failed","");
      pEVar3 = (ErrorResult *)operator_new(0x38);
      pEVar3->Source = "tonk_socket_create";
      (pEVar3->Description)._M_dataplus._M_p = (pointer)&(pEVar3->Description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pEVar3->Description,local_50._0_8_,
                 (char *)(local_50._8_8_ + local_50._0_8_));
      pEVar3->Type = Siamese;
      pEVar3->Code = (long)iVar2;
    }
    else {
      local_50._0_8_ = local_50 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"config.Version does not match TONK_VERSION in header","");
      pEVar3 = (ErrorResult *)operator_new(0x38);
      pEVar3->Source = "tonk_socket_create";
      (pEVar3->Description)._M_dataplus._M_p = (pointer)&(pEVar3->Description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pEVar3->Description,local_50._0_8_,
                 (char *)(local_50._8_8_ + local_50._0_8_));
      pEVar3->Type = Tonk;
      pEVar3->Code = 1;
    }
LAB_001318e1:
    local_50._32_4_ = 0;
    local_50._36_4_ = 0;
    local_58.Error = pEVar3;
    tonk::Result::~Result((Result *)(local_50 + 0x20));
    if ((ErrorResult *)local_50._0_8_ != (ErrorResult *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_);
    }
LAB_00131905:
    *socketOut = (TonkSocket)0x0;
  }
  DecrementSessionCounter();
LAB_00131911:
  if (errorJsonOut != (TonkJson *)0x0) {
    tonk::Result::ToJson_abi_cxx11_((string *)local_50,&local_58);
    uVar1 = local_50._0_8_;
    strncpy(errorJsonOut->JsonString,(char *)local_50._0_8_,0x400);
    errorJsonOut->JsonString[0x3ff] = '\0';
    if ((ErrorResult *)uVar1 != (ErrorResult *)(local_50 + 0x10)) {
      operator_delete((void *)uVar1);
    }
  }
  if (local_58.Error == (ErrorResult *)0x0) {
    TVar4 = Tonk_Success;
  }
  else {
    switch((local_58.Error)->Type) {
    case Tonk:
      TVar4 = (TonkResult)(local_58.Error)->Code;
      break;
    case Siamese:
      TVar4 = Tonk_FECFailed;
      break;
    case Asio:
    case LastErr:
      TVar4 = Tonk_NetworkFailed;
      break;
    case Cymric:
      TVar4 = Tonk_PRNGFailed;
      break;
    default:
      TVar4 = Tonk_Error;
    }
  }
  tonk::Result::~Result(&local_58);
  return TVar4;
}

Assistant:

TONK_EXPORT TonkResult tonk_socket_create(
    const TonkSocketConfig* config, // Configuration for the socket
    TonkSocket*          socketOut, // Created socket, or 0 on failure
    TonkJson*         errorJsonOut  // Receives detailed error message on error
)
{
    IncrementSessionCounter();

    ApplicationSession* session = nullptr;
    Result result;
    int siameseResult;

    if (!config || !socketOut)
    {
        result = Result("tonk_socket_create", "Null parameter");
        TONK_DEBUG_BREAK(); // Invalid input
        goto OnError;
    }

    if (config->Version != TONK_VERSION)
    {
        TONK_DEBUG_BREAK(); // Invalid input
        result = Result("tonk_socket_create", "config.Version does not match TONK_VERSION in header", ErrorType::Tonk, Tonk_InvalidInput);
        goto OnError;
    }

    siameseResult = siamese_init();
    if (0 != siameseResult)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        result = Result("tonk_socket_create", "siamese_init failed", ErrorType::Siamese, siameseResult);
        goto OnError;
    }

    result = SecureRandom_Initialize();
    if (result.IsFail())
    {
        TONK_DEBUG_BREAK(); // Should never happen
        goto OnError;
    }

    result = InitializeAddressHash();
    if (result.IsFail())
    {
        TONK_DEBUG_BREAK(); // PRNG failed
        goto OnError;
    }

    result = ValidateTonkSocketConfig(config);
    if (result.IsFail())
    {
        TONK_DEBUG_BREAK(); // Invalid input
        goto OnError;
    }

    session = new (std::nothrow) ApplicationSession;
    if (!session)
    {
        TONK_DEBUG_BREAK(); // Out of memory
        result = Result("tonk_socket_create", "Out of memory");
        goto OnError;
    }

    result = session->Initialize(*config);
    if (result.IsFail())
    {
        delete session;
        session = nullptr;
        goto OnError;
    }

OnError:
    if (socketOut)
        *socketOut = reinterpret_cast<TonkSocket>(session);

    if (!session)
        DecrementSessionCounter();

    // Write optional error json object
    if (errorJsonOut)
        SafeCopyCStr(
            errorJsonOut->JsonString,
            TONK_ERROR_JSON_MAX_BYTES,
            result.ToJson().c_str());
    return TonkResultFromDetailedResult(result);
}